

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall Grid::setslime(Grid *this,point p,bool slime)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  cg_box *pcVar5;
  uint *puVar6;
  cg_other *pcVar7;
  value_type local_74;
  point local_68;
  point local_60;
  reference local_58;
  cgo_char *d;
  iterator __end1;
  iterator __begin1;
  vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *__range1;
  bool slime_local;
  Grid *this_local;
  point p_local;
  
  pcVar5 = refc<cg_box>::operator->(&this->box);
  bVar4 = cg_box::contains(pcVar5,p);
  if (bVar4) {
    uniquify<cg_box>(&this->box);
    pcVar5 = refc<cg_box>::operator->(&this->box);
    puVar6 = (uint *)cg_box::at(pcVar5,p);
    uVar1 = *puVar6;
    uVar2 = this->SLIMEBIT;
    iVar3 = this->SLIMEBIT_SHIFT;
    pcVar5 = refc<cg_box>::operator->(&this->box);
    puVar6 = (uint *)cg_box::at(pcVar5,p);
    *puVar6 = uVar1 & (uVar2 ^ 0xffffffff) | (uint)slime << ((byte)iVar3 & 0x1f);
  }
  else {
    uniquify<cg_other>(&this->other);
    pcVar7 = refc<cg_other>::operator->(&this->other);
    __end1 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::begin
                       (&pcVar7->data);
    d = (cgo_char *)
        std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::end(&pcVar7->data);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
                                       *)&d), bVar4) {
      local_58 = __gnu_cxx::
                 __normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
                 ::operator*(&__end1);
      local_60 = local_58->p;
      local_68 = p;
      bVar4 = operator==(local_60,p);
      if (bVar4) {
        local_58->ch = local_58->ch & (this->SLIMEBIT ^ 0xffffffffU) |
                       (uint)slime << ((byte)this->SLIMEBIT_SHIFT & 0x1f);
        return;
      }
      __gnu_cxx::
      __normal_iterator<cg_other::cgo_char_*,_std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>_>
      ::operator++(&__end1);
    }
    pcVar7 = refc<cg_other>::operator->(&this->other);
    local_74.ch = this->SLIMEBIT | 0x80000000;
    local_74.p = p;
    std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::push_back
              (&pcVar7->data,&local_74);
  }
  return;
}

Assistant:

void Grid::setslime(point p, bool slime) {
    if (box->contains(p)) {
        uniquify(box);
        box->at(p) = (box->at(p) & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
        return;
    }
    uniquify(other);
    for (auto &d: other->data) {
        if (d.p == p) {
            d.ch = (d.ch & ~SLIMEBIT) | (slime << SLIMEBIT_SHIFT);
            return;
        }
    }
    other->data.push_back({ p, OUT_CHAR | SLIMEBIT });
}